

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

RepeatedFieldAccessor * __thiscall
google::protobuf::Reflection::RepeatedFieldAccessor(Reflection *this,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  FieldOptions *this_00;
  LogFinisher local_a9;
  LogMessage local_a8;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  FieldDescriptor *local_20;
  FieldDescriptor *field_local;
  Reflection *this_local;
  
  local_20 = field;
  field_local = (FieldDescriptor *)this;
  bVar1 = FieldDescriptor::is_repeated(field);
  local_59 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x155);
    local_59 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_58,"CHECK failed: field->is_repeated(): ");
    internal::LogFinisher::operator=(local_6d,pLVar3);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  CVar2 = FieldDescriptor::cpp_type(local_20);
  switch(CVar2) {
  case CPPTYPE_INT32:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>>();
    break;
  case CPPTYPE_INT64:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>();
    break;
  case CPPTYPE_UINT32:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>
                           ();
    break;
  case CPPTYPE_UINT64:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>
                           ();
    break;
  case CPPTYPE_DOUBLE:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>();
    break;
  case CPPTYPE_FLOAT:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>();
    break;
  case CPPTYPE_BOOL:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>();
    break;
  case CPPTYPE_ENUM:
    this_local = (Reflection *)
                 (anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>>();
    break;
  case CPPTYPE_STRING:
    this_00 = FieldDescriptor::options(local_20);
    FieldOptions::ctype(this_00);
    this_local = (Reflection *)
                 anon_unknown_0::
                 GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>();
    break;
  case CPPTYPE_MESSAGE:
    bVar1 = FieldDescriptor::is_map(local_20);
    if (bVar1) {
      this_local = (Reflection *)
                   anon_unknown_0::GetSingleton<google::protobuf::internal::MapFieldAccessor>();
    }
    else {
      this_local = (Reflection *)
                   anon_unknown_0::
                   GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>();
    }
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x171);
    pLVar3 = internal::LogMessage::operator<<(&local_a8,"Should not reach here.");
    internal::LogFinisher::operator=(&local_a9,pLVar3);
    internal::LogMessage::~LogMessage(&local_a8);
    this_local = (Reflection *)0x0;
  }
  return (RepeatedFieldAccessor *)this_local;
}

Assistant:

const internal::RepeatedFieldAccessor* Reflection::RepeatedFieldAccessor(
    const FieldDescriptor* field) const {
  GOOGLE_CHECK(field->is_repeated());
  switch (field->cpp_type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, type) \
  case FieldDescriptor::CPPTYPE_##TYPE:   \
    return GetSingleton<internal::RepeatedFieldPrimitiveAccessor<type> >();
    HANDLE_PRIMITIVE_TYPE(INT32, int32_t)
    HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t)
    HANDLE_PRIMITIVE_TYPE(INT64, int64_t)
    HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t)
    HANDLE_PRIMITIVE_TYPE(FLOAT, float)
    HANDLE_PRIMITIVE_TYPE(DOUBLE, double)
    HANDLE_PRIMITIVE_TYPE(BOOL, bool)
    HANDLE_PRIMITIVE_TYPE(ENUM, int32_t)
#undef HANDLE_PRIMITIVE_TYPE
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->options().ctype()) {
        default:
        case FieldOptions::STRING:
          return GetSingleton<internal::RepeatedPtrFieldStringAccessor>();
      }
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (field->is_map()) {
        return GetSingleton<internal::MapFieldAccessor>();
      } else {
        return GetSingleton<internal::RepeatedPtrFieldMessageAccessor>();
      }
  }
  GOOGLE_LOG(FATAL) << "Should not reach here.";
  return nullptr;
}